

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O1

floatx80 floatx80_mul(floatx80 a,floatx80 b)

{
  floatx80 fVar1;
  floatx80 fVar2;
  uint uVar3;
  uint uVar4;
  bits64 zSig0;
  uint uVar5;
  int32 zExp;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  bits64 zSig1;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  floatx80 a_00;
  floatx80 fVar12;
  
  a_00.low = a.low;
  fVar12.low = b.low;
  fVar12._0_4_ = b._0_4_;
  a_00._0_4_ = a._0_4_;
  uVar5 = fVar12._0_4_ & 0x7fff;
  uVar4 = fVar12._0_4_ ^ a_00._0_4_;
  if ((~a_00._0_4_ & 0x7fff) == 0) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        uVar5 != 0x7fff)) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 ||
          fVar12.low != 0) {
LAB_0046a086:
        fVar2._4_4_ = 0;
        fVar2._0_4_ = uVar4 | 0x7fff;
        fVar2.low = 0x8000000000000000;
        return fVar2;
      }
LAB_0046a090:
      float_exception_flags = float_exception_flags | 1;
      fVar1._4_4_ = 0;
      fVar1._2_2_ = (ushort)(uVar4 >> 0x10);
      fVar1.high = 0xffff;
      fVar1.low = 0xffffffffffffffff;
      return fVar1;
    }
LAB_00469f10:
    a_00._4_4_ = 0;
    fVar12._4_4_ = 0;
    fVar12 = propagateFloatx80NaN(a_00,fVar12);
    return fVar12;
  }
  uVar7 = a_00._0_4_ & 0x7fff;
  if (uVar5 == 0x7fff) {
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || a_00.low != 0
         ) goto LAB_0046a086;
      goto LAB_0046a090;
    }
    goto LAB_00469f10;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (a_00.low == 0) goto LAB_0046a0c3;
    uVar8 = a_00.low >> 0x20;
    uVar10 = uVar8;
    if (uVar8 == 0) {
      uVar10 = a_00.low;
    }
    uVar7 = (uint)uVar10 << 0x10;
    if (uVar10 >= 0x10000) {
      uVar7 = (uint)uVar10;
    }
    bVar9 = (uVar10 < 0x10000) * '\x10';
    bVar6 = bVar9 + 8;
    uVar3 = uVar7 << 8;
    if (0xffffff < uVar7) {
      bVar6 = bVar9;
      uVar3 = uVar7;
    }
    bVar6 = (bVar6 | (uVar8 == 0) << 5) + countLeadingZeros32_countLeadingZerosHigh[uVar3 >> 0x18];
    a_00.low = a_00.low << (bVar6 & 0x3f);
    uVar7 = 1 - (int)(char)bVar6;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (fVar12.low == 0) {
LAB_0046a0c3:
      return (floatx80)ZEXT416(uVar4 & 0x8000);
    }
    uVar8 = fVar12.low >> 0x20;
    uVar10 = uVar8;
    if (uVar8 == 0) {
      uVar10 = fVar12.low;
    }
    uVar5 = (uint)uVar10 << 0x10;
    if (uVar10 >= 0x10000) {
      uVar5 = (uint)uVar10;
    }
    bVar9 = (uVar10 < 0x10000) * '\x10';
    bVar6 = bVar9 + 8;
    uVar3 = uVar5 << 8;
    if (0xffffff < uVar5) {
      bVar6 = bVar9;
      uVar3 = uVar5;
    }
    bVar6 = (bVar6 | (uVar8 == 0) << 5) + countLeadingZeros32_countLeadingZerosHigh[uVar3 >> 0x18];
    fVar12.low = fVar12.low << (bVar6 & 0x3f);
    uVar5 = 1 - (int)(char)bVar6;
  }
  uVar10 = (a_00.low & 0xffffffff) * (fVar12.low >> 0x20);
  uVar8 = (fVar12.low & 0xffffffff) * (a_00.low >> 0x20);
  uVar11 = uVar8 + uVar10;
  zSig1 = fVar12.low * a_00.low;
  zSig0 = (uVar11 >> 0x20) + (fVar12.low >> 0x20) * (a_00.low >> 0x20) +
          ((ulong)CARRY8(uVar8,uVar10) << 0x20) + (ulong)(zSig1 < uVar11 << 0x20);
  if ((long)zSig0 < 1) {
    zExp = uVar5 + uVar7 + -0x3ffe;
  }
  else {
    zSig0 = zSig0 * 2 | zSig1 >> 0x3f;
    zSig1 = zSig1 * 2;
    zExp = uVar5 + uVar7 + -0x3fff;
  }
  fVar12 = roundAndPackFloatx80
                     (floatx80_rounding_precision,(flag)((uVar4 & 0xffff) >> 0xf),zExp,zSig0,zSig1);
  return fVar12;
}

Assistant:

floatx80 floatx80_mul( floatx80 a, floatx80 b )
{
	flag aSign, bSign, zSign;
	int32 aExp, bExp, zExp;
	bits64 aSig, bSig, zSig0, zSig1;
	floatx80 z;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	bSig = extractFloatx80Frac( b );
	bExp = extractFloatx80Exp( b );
	bSign = extractFloatx80Sign( b );
	zSign = aSign ^ bSign;
	if ( aExp == 0x7FFF ) {
		if (    (bits64) ( aSig<<1 )
				|| ( ( bExp == 0x7FFF ) && (bits64) ( bSig<<1 ) ) ) {
			return propagateFloatx80NaN( a, b );
		}
		if ( ( bExp | bSig ) == 0 ) goto invalid;
		return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
	}
	if ( bExp == 0x7FFF ) {
		if ( (bits64) ( bSig<<1 ) ) return propagateFloatx80NaN( a, b );
		if ( ( aExp | aSig ) == 0 ) {
	invalid:
			float_raise( float_flag_invalid );
			z.low = floatx80_default_nan_low;
			z.high = floatx80_default_nan_high;
			return z;
		}
		return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
	}
	if ( aExp == 0 ) {
		if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
		normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
	}
	if ( bExp == 0 ) {
		if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
		normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
	}
	zExp = aExp + bExp - 0x3FFE;
	mul64To128( aSig, bSig, &zSig0, &zSig1 );
	if ( 0 < (sbits64) zSig0 ) {
		shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
		--zExp;
	}
	return
		roundAndPackFloatx80(
			floatx80_rounding_precision, zSign, zExp, zSig0, zSig1 );

}